

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O3

QWidget * __thiscall QMainWindowLayoutState::centralWidget(QMainWindowLayoutState *this)

{
  QLayoutItem *pQVar1;
  int iVar2;
  undefined4 extraout_var;
  
  pQVar1 = (this->dockAreaLayout).centralWidgetItem;
  if (pQVar1 != (QLayoutItem *)0x0) {
    iVar2 = (*pQVar1->_vptr_QLayoutItem[0xd])();
    return (QWidget *)CONCAT44(extraout_var,iVar2);
  }
  return (QWidget *)0x0;
}

Assistant:

QWidget *QMainWindowLayoutState::centralWidget() const
{
    QLayoutItem *item = nullptr;

#if QT_CONFIG(dockwidget)
    item = dockAreaLayout.centralWidgetItem;
#else
    item = centralWidgetItem;
#endif

    if (item != nullptr)
        return item->widget();
    return nullptr;
}